

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parserInternals.c
# Opt level: O1

void xmlDetectEncoding(xmlParserCtxtPtr ctxt)

{
  byte bVar1;
  byte bVar2;
  xmlParserInputPtr pxVar3;
  byte *pbVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  int iVar8;
  xmlParserErrors code;
  xmlCharEncError xVar9;
  ulong uVar10;
  ulong uVar11;
  xmlCharEncoding enc;
  uint uVar12;
  long lVar13;
  ulong uVar14;
  xmlCharEncodingHandlerPtr handler_00;
  xmlCharEncodingHandlerPtr handler;
  int inlen;
  xmlChar out [200];
  xmlCharEncodingHandler *local_f8;
  int local_f0;
  undefined4 local_ec;
  byte local_e8 [200];
  
  iVar8 = xmlParserGrow(ctxt);
  if (iVar8 < 0) {
    return;
  }
  pxVar3 = ctxt->input;
  pbVar4 = pxVar3->cur;
  if ((long)pxVar3->end - (long)pbVar4 < 4) {
    return;
  }
  bVar1 = *pbVar4;
  if ((pxVar3->flags & 1U) != 0) {
    if (bVar1 != 0xef) {
      return;
    }
    if (pbVar4[1] != 0xbb) {
      return;
    }
    if (pbVar4[2] != 0xbf) {
      return;
    }
    pxVar3->cur = pbVar4 + 3;
    return;
  }
  bVar5 = true;
  if (bVar1 < 0xef) {
    if (bVar1 == 0) {
      if ((((ctxt->html == 0) && (pbVar4[1] == 0)) && (pbVar4[2] == 0)) && (pbVar4[3] == 0x3c)) {
        enc = XML_CHAR_ENCODING_UCS4BE;
LAB_001435d5:
        uVar12 = 8;
      }
      else {
        if (((pbVar4[1] != 0x3c) || (pbVar4[2] != 0)) || (pbVar4[3] != 0x3f)) goto LAB_00143369;
        enc = XML_CHAR_ENCODING_UTF16BE;
        uVar12 = 6;
      }
LAB_001435db:
      bVar6 = false;
      lVar13 = 0;
LAB_0014333e:
      bVar5 = false;
      bVar7 = false;
      goto LAB_00143374;
    }
    if (bVar1 == 0x3c) {
      if (pbVar4[1] == 0) {
        if (((ctxt->html == 0) && (pbVar4[2] == 0)) && (pbVar4[3] == 0)) {
          enc = XML_CHAR_ENCODING_UCS4LE;
          goto LAB_001435d5;
        }
        if ((pbVar4[2] == 0x3f) && (pbVar4[3] == 0)) {
          enc = XML_CHAR_ENCODING_UTF16LE;
          uVar12 = 4;
          goto LAB_001435db;
        }
      }
    }
    else if ((((bVar1 == 0x4c) && (ctxt->html == 0)) && (pbVar4[1] == 0x6f)) &&
            ((pbVar4[2] == 0xa7 && (pbVar4[3] == 0x94)))) {
      enc = XML_CHAR_ENCODING_EBCDIC;
      bVar7 = true;
      uVar12 = 8;
      bVar6 = false;
      lVar13 = 0;
      bVar5 = false;
      goto LAB_00143374;
    }
  }
  else {
    if (bVar1 == 0xef) {
      if ((pbVar4[1] != 0xbb) || (pbVar4[2] != 0xbf)) goto LAB_00143369;
      enc = XML_CHAR_ENCODING_UTF8;
      uVar12 = 2;
      lVar13 = 3;
LAB_0014333b:
      bVar6 = true;
      goto LAB_0014333e;
    }
    if (bVar1 == 0xfe) {
      if (pbVar4[1] == 0xff) {
        enc = XML_CHAR_ENCODING_UTF16BE;
        uVar12 = 6;
        goto LAB_00143335;
      }
    }
    else if ((bVar1 == 0xff) && (pbVar4[1] == 0xfe)) {
      enc = XML_CHAR_ENCODING_UTF16LE;
      uVar12 = 4;
LAB_00143335:
      lVar13 = 2;
      goto LAB_0014333b;
    }
  }
LAB_00143369:
  bVar6 = false;
  lVar13 = 0;
  uVar12 = 0;
  bVar7 = false;
  enc = XML_CHAR_ENCODING_NONE;
LAB_00143374:
  if (bVar6) {
    pxVar3->cur = pbVar4 + lVar13;
  }
  if (!bVar5) {
    pxVar3->flags = uVar12 | pxVar3->flags;
    if (!bVar7) {
      xmlSwitchEncoding(ctxt,enc);
      return;
    }
    code = xmlCreateCharEncodingHandler
                     ("IBM037",XML_ENC_INPUT,ctxt->convImpl,ctxt->convCtxt,&local_f8);
    if (code == XML_ERR_OK) {
      local_f0 = 199;
      local_ec = *(int *)&pxVar3->end - (int)pxVar3->cur;
      xVar9 = xmlEncInputChunk(local_f8,local_e8,&local_f0,pxVar3->cur,&local_ec,0);
      handler_00 = (xmlCharEncodingHandlerPtr)0x0;
      if (XML_ENC_ERR_INTERNAL < xVar9) {
        local_e8[local_f0] = 0;
        handler_00 = (xmlCharEncodingHandlerPtr)0x0;
        if (0 < (long)local_f0) {
          lVar13 = 0;
          do {
            if (local_e8[lVar13] == 0x65) {
              iVar8 = xmlStrncmp(local_e8 + lVar13,"encoding",8);
              if (iVar8 == 0) {
                uVar14 = lVar13 + 10;
                goto LAB_0014347f;
              }
            }
            else {
              handler_00 = (xmlCharEncodingHandlerPtr)0x0;
              if (local_e8[lVar13] == 0x3e) break;
            }
            lVar13 = lVar13 + 1;
            handler_00 = (xmlCharEncodingHandlerPtr)0x0;
          } while (lVar13 < local_f0);
        }
      }
LAB_00143571:
      xmlCharEncCloseFunc(local_f8);
      code = xmlCreateCharEncodingHandler
                       ("IBM037",XML_ENC_INPUT,ctxt->convImpl,ctxt->convCtxt,&local_f8);
      if (code == XML_ERR_OK) {
        handler_00 = local_f8;
      }
    }
    else {
      handler_00 = (xmlCharEncodingHandlerPtr)0x0;
    }
LAB_001435a6:
    if (code == XML_ERR_OK) {
      xmlSwitchToEncoding(ctxt,handler_00);
    }
    else {
      xmlFatalErr(ctxt,code,"detecting EBCDIC\n");
    }
  }
  return;
LAB_0014347f:
  uVar10 = (ulong)local_e8[uVar14 - 2];
  code = (xmlParserErrors)local_e8[uVar14 - 2];
  if (0x3d < uVar10) goto LAB_00143568;
  if ((0x100002600U >> (uVar10 & 0x3f) & 1) == 0) {
    if (uVar10 == 0x3d) goto LAB_001434a4;
    goto LAB_00143568;
  }
  uVar14 = uVar14 + 1;
  goto LAB_0014347f;
LAB_001434a4:
  bVar1 = local_e8[uVar14 - 1];
  uVar10 = (ulong)bVar1;
  code = (xmlParserErrors)bVar1;
  if (0x27 < uVar10) goto LAB_00143568;
  if ((0x100002600U >> (uVar10 & 0x3f) & 1) != 0) goto code_r0x001434ba;
  if ((0x8400000000U >> (uVar10 & 0x3f) & 1) == 0) goto LAB_00143568;
  uVar11 = (ulong)(int)uVar14;
  uVar10 = uVar14 & 0xffffffff;
  while (((bVar2 = local_e8[uVar10], (byte)(bVar2 - 0x30) < 10 ||
          ((byte)((bVar2 & 0xdf) + 0xbf) < 0x1a)) ||
         ((bVar2 - 0x2d < 0x33 && ((0x4000000000003U >> ((ulong)(bVar2 - 0x2d) & 0x3f) & 1) != 0))))
        ) {
    uVar11 = uVar11 + 1;
    uVar10 = uVar11;
  }
  if (bVar2 == bVar1) {
    local_e8[uVar11 & 0xffffffff] = 0;
    xmlCharEncCloseFunc(local_f8);
    code = xmlCreateCharEncodingHandler
                     ((char *)(local_e8 + (uVar14 & 0xffffffff)),XML_ENC_INPUT,ctxt->convImpl,
                      ctxt->convCtxt,&local_f8);
    bVar5 = false;
    handler_00 = local_f8;
    if (code != XML_ERR_OK) {
      handler_00 = (xmlCharEncodingHandlerPtr)0x0;
    }
  }
  else {
LAB_00143568:
    bVar5 = true;
    handler_00 = (xmlCharEncodingHandlerPtr)0x0;
  }
  if (bVar5) goto LAB_00143571;
  goto LAB_001435a6;
code_r0x001434ba:
  uVar14 = uVar14 + 1;
  goto LAB_001434a4;
}

Assistant:

void
xmlDetectEncoding(xmlParserCtxtPtr ctxt) {
    const xmlChar *in;
    xmlCharEncoding enc;
    int bomSize;
    int autoFlag = 0;

    if (xmlParserGrow(ctxt) < 0)
        return;
    in = ctxt->input->cur;
    if (ctxt->input->end - in < 4)
        return;

    if (ctxt->input->flags & XML_INPUT_HAS_ENCODING) {
        /*
         * If the encoding was already set, only skip the BOM which was
         * possibly decoded to UTF-8.
         */
        if ((in[0] == 0xEF) && (in[1] == 0xBB) && (in[2] == 0xBF)) {
            ctxt->input->cur += 3;
        }

        return;
    }

    enc = XML_CHAR_ENCODING_NONE;
    bomSize = 0;

    /*
     * BOM sniffing and detection of initial bytes of an XML
     * declaration.
     *
     * The HTML5 spec doesn't cover UTF-32 (UCS-4) or EBCDIC.
     */
    switch (in[0]) {
        case 0x00:
            if ((!ctxt->html) &&
                (in[1] == 0x00) && (in[2] == 0x00) && (in[3] == 0x3C)) {
                enc = XML_CHAR_ENCODING_UCS4BE;
                autoFlag = XML_INPUT_AUTO_OTHER;
            } else if ((in[1] == 0x3C) && (in[2] == 0x00) && (in[3] == 0x3F)) {
                /*
                 * TODO: The HTML5 spec requires to check that the
                 * next codepoint is an 'x'.
                 */
                enc = XML_CHAR_ENCODING_UTF16BE;
                autoFlag = XML_INPUT_AUTO_UTF16BE;
            }
            break;

        case 0x3C:
            if (in[1] == 0x00) {
                if ((!ctxt->html) &&
                    (in[2] == 0x00) && (in[3] == 0x00)) {
                    enc = XML_CHAR_ENCODING_UCS4LE;
                    autoFlag = XML_INPUT_AUTO_OTHER;
                } else if ((in[2] == 0x3F) && (in[3] == 0x00)) {
                    /*
                     * TODO: The HTML5 spec requires to check that the
                     * next codepoint is an 'x'.
                     */
                    enc = XML_CHAR_ENCODING_UTF16LE;
                    autoFlag = XML_INPUT_AUTO_UTF16LE;
                }
            }
            break;

        case 0x4C:
	    if ((!ctxt->html) &&
                (in[1] == 0x6F) && (in[2] == 0xA7) && (in[3] == 0x94)) {
	        enc = XML_CHAR_ENCODING_EBCDIC;
                autoFlag = XML_INPUT_AUTO_OTHER;
            }
            break;

        case 0xEF:
            if ((in[1] == 0xBB) && (in[2] == 0xBF)) {
                enc = XML_CHAR_ENCODING_UTF8;
                autoFlag = XML_INPUT_AUTO_UTF8;
                bomSize = 3;
            }
            break;

        case 0xFE:
            if (in[1] == 0xFF) {
                enc = XML_CHAR_ENCODING_UTF16BE;
                autoFlag = XML_INPUT_AUTO_UTF16BE;
                bomSize = 2;
            }
            break;

        case 0xFF:
            if (in[1] == 0xFE) {
                enc = XML_CHAR_ENCODING_UTF16LE;
                autoFlag = XML_INPUT_AUTO_UTF16LE;
                bomSize = 2;
            }
            break;
    }

    if (bomSize > 0) {
        ctxt->input->cur += bomSize;
    }

    if (enc != XML_CHAR_ENCODING_NONE) {
        ctxt->input->flags |= autoFlag;

        if (enc == XML_CHAR_ENCODING_EBCDIC) {
            xmlCharEncodingHandlerPtr handler;
            xmlParserErrors res;

            res = xmlDetectEBCDIC(ctxt, &handler);
            if (res != XML_ERR_OK) {
                xmlFatalErr(ctxt, res, "detecting EBCDIC\n");
            } else {
                xmlSwitchToEncoding(ctxt, handler);
            }
        } else {
            xmlSwitchEncoding(ctxt, enc);
        }
    }
}